

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen10Texture.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmGen10TextureCalc::FillTex2D
          (GmmGen10TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_struct_8_45_9b07292e_for_Gpu aVar3;
  bool bVar4;
  uint8_t uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int iVar10;
  GMM_STATUS GVar11;
  uint32_t NumSamples;
  ulong WidthBytesPhysical;
  uint32_t uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  uint32_t local_7c;
  __GMM_BUFFER_TYPE *p_Stack_78;
  uint32_t CompressDepth;
  GMM_PLATFORM_INFO *local_70;
  uint local_64;
  uint local_60;
  uint32_t CompressHeight;
  uint32_t CompressWidth;
  uint uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  uint32_t local_3c;
  uint32_t local_38;
  uint8_t local_31;
  
  if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0 || pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return GMM_ERROR;
  }
  p_Stack_78 = pRestrictions;
  local_70 = GmmGetPlatformInfo((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext
                               );
  CompressWidth = (uint32_t)pTexInfo->BaseWidth;
  uVar12 = (pTexInfo->MSAA).NumSamples;
  (pTexInfo->MSAA).NumSamples = uVar12 + (uVar12 == 0);
  auVar14._0_8_ = -(ulong)(((ulong)(pTexInfo->Flags).Gpu & 0x20000000002) == 0x20000000002);
  auVar14._8_8_ = -(ulong)(((ulong)(pTexInfo->Flags).Info & 0x6000000000) == 0);
  uVar6 = movmskpd((int)local_70,auVar14);
  local_38 = 8;
  if ((uVar6 & 1) == 0) {
    local_38 = pTexInfo->BitsPerPixel;
  }
  if ((uVar6 & 2) == 0) {
    GmmTextureCalc::FindMipTailStartLod((GmmTextureCalc *)this,pTexInfo);
  }
  uVar6 = pTexInfo->ArraySize;
  uVar9 = 1;
  uVar12 = 1;
  if (pTexInfo->Type == RESOURCE_3D) {
    uVar12 = pTexInfo->Depth;
  }
  aVar3 = (pTexInfo->Flags).Gpu;
  if ((((ulong)aVar3 & 0x20000040) == 0) && (((ulong)(pTexInfo->Flags).Info & 0x6000000000) == 0)) {
    uVar9 = (pTexInfo->MSAA).NumSamples;
  }
  uVar7 = ((uint)(pTexInfo->Type == RESOURCE_CUBE) * 5 + 1) * (uVar6 + (uVar6 == 0)) * uVar12 *
          uVar9;
  if ((((ulong)(pTexInfo->Flags).Info & 0x6000000000) != 0) &&
     (uVar13 = local_70->TileInfo[pTexInfo->TileMode].LogicalTileDepth, uVar13 != 0)) {
    uVar7 = ((uVar7 - 1) + uVar13) / uVar13;
  }
  uVar13 = uVar7;
  if ((((ulong)aVar3 & 0x18) != 0) &&
     (((uVar7 != uVar6 || 2 < uVar7 ||
       ((3 < pTexInfo->Format - GMM_FORMAT_B8G8R8A8_UNORM &&
        (1 < pTexInfo->Format - GMM_FORMAT_R8G8B8A8_UNORM)))) ||
      ((uVar13 = 4,
       ((byte)(((ulong)aVar3 & 0xffffffff) >> 3) & 0x1f & (CompressWidth & 0xf) == 0) == 0 &&
       ((((ulong)aVar3 & 0x10) == 0 || (CompressWidth % 0xc != 0)))))))) {
    (pTexInfo->Flags).Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar3 & 0xffffffffffffffe7);
    uVar13 = uVar7;
  }
  local_3c = (pTexInfo->Alignment).HAlign;
  uVar12 = (pTexInfo->Alignment).VAlign;
  GmmTextureCalc::GetCompressionBlockDimensions
            ((GmmTextureCalc *)this,pTexInfo->Format,&local_60,&local_64,&local_7c);
  local_31 = GmmIsCompressed((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext,
                             pTexInfo->Format);
  if (uVar13 < 2) {
    (pTexInfo->Alignment).QPitch = 0;
    CompressHeight =
         (*(this->super_GmmGen9TextureCalc).super_GmmTextureCalc._vptr_GmmTextureCalc[6])
                   (this,pTexInfo);
    uVar9 = CompressWidth;
  }
  else {
    if (((((pTexInfo->Type == RESOURCE_3D) && (((pTexInfo->Flags).Info.field_0x2 & 8) == 0)) ||
         ((((pTexInfo->Flags).Gpu.field_0x3 & 2) != 0 &&
          (((uint)(((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext)->SkuTable)
                  .field_5 & 2) != 0)))) || (((pTexInfo->Flags).Wa.field_0x1 & 8) != 0)) &&
       (uVar12 = local_70->TileInfo[pTexInfo->TileMode].LogicalTileHeight,
       ((pTexInfo->Flags).Gpu.field_0x3 & 0x20) != 0)) {
      uVar12 = uVar12 << ((byte)((ulong)(pTexInfo->Flags).Info >> 0x22) & 1);
    }
    uVar8 = GmmGen9TextureCalc::Get2DMipMapTotalHeight(&this->super_GmmGen9TextureCalc,pTexInfo);
    uVar9 = CompressWidth;
    if (uVar12 != 0) {
      uVar6 = (uVar12 - 1) + uVar8;
      uVar8 = uVar6 - uVar6 % uVar12;
    }
    (pTexInfo->Alignment).QPitch = uVar8;
    if (local_31 == '\0') {
      aVar3 = (pTexInfo->Flags).Gpu;
      if (((aVar3._0_4_ >> 0x1d & 1) == 0) || (((pTexInfo->Flags).Info.field_0x4 & 4) == 0)) {
        uVar6 = uVar8 >> 4;
        if ((~(ulong)aVar3 & 0x20000000002) != 0) {
          uVar6 = uVar8;
        }
      }
      else {
        uVar6 = uVar8 >> 1;
      }
    }
    else {
      if (local_64 != 0) {
        uVar8 = ((uVar8 - 1) + local_64) / local_64;
      }
      uVar6 = (*(this->super_GmmGen9TextureCalc).super_GmmTextureCalc._vptr_GmmTextureCalc[0xb])
                        (this,pTexInfo,(ulong)uVar8,(ulong)uVar13);
    }
    CompressHeight = uVar6 * uVar13;
  }
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
    uVar12 = 1;
  }
  else {
    uVar12 = (pTexInfo->MSAA).NumSamples;
  }
  uVar12 = GmmTextureCalc::ExpandWidth((GmmTextureCalc *)this,uVar9,local_3c,uVar12);
  if ((((((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext)->WaTable).field_0x9
       & 0x10) != 0) && (bVar4 = GmmIsYUVFormatLCUAligned(pTexInfo->Format), bVar4)) {
    uVar12 = uVar12 + 0x3f & 0xffffffc0;
  }
  uVar6 = uVar12;
  if (((((ulong)(pTexInfo->Flags).Info & 0x6000000000) == 0) ||
      (1 < (pTexInfo->Alignment).MipTailStartLod)) && (1 < pTexInfo->MaxLod)) {
    NumSamples = 1;
    uVar8 = 1;
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      uVar8 = (pTexInfo->MSAA).NumSamples;
    }
    uVar9 = GmmTextureCalc::ExpandWidth((GmmTextureCalc *)this,uVar9 >> 1,local_3c,uVar8);
    CompressWidth = CompressWidth >> 2;
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      NumSamples = (pTexInfo->MSAA).NumSamples;
    }
    uVar8 = GmmTextureCalc::ExpandWidth((GmmTextureCalc *)this,CompressWidth,local_3c,NumSamples);
    uVar6 = uVar8 + uVar9;
    if (uVar8 + uVar9 < uVar12) {
      uVar6 = uVar12;
    }
  }
  if (local_31 == '\0') {
    aVar3 = (pTexInfo->Flags).Gpu;
    if (((aVar3._0_4_ >> 0x1d & 1) == 0) || (((pTexInfo->Flags).Info.field_0x4 & 4) == 0)) {
      if ((~(ulong)aVar3 & 0x20000000002) == 0) {
        uVar12 = pTexInfo->BitsPerPixel;
        if (uVar12 == 0x80) {
          uVar6 = uVar6 >> 1;
          goto LAB_001b3738;
        }
        if (uVar12 != 0x40) {
          if (uVar12 == 0x20) {
            uVar6 = uVar6 >> 3;
          }
          goto LAB_001b3738;
        }
      }
      else {
        if (((ulong)aVar3 & 8) == 0) {
          if (((ulong)aVar3 & 0x10) != 0) {
            uVar6 = (uVar6 * pTexInfo->ArraySize) / 3;
          }
          goto LAB_001b3738;
        }
        uVar6 = uVar6 * pTexInfo->ArraySize;
      }
      uVar6 = uVar6 >> 2;
    }
    else {
      uVar6 = uVar6 * 2;
    }
  }
  else if (local_60 != 0) {
    uVar6 = ((uVar6 - 1) + local_60) / local_60;
  }
LAB_001b3738:
  uVar6 = uVar6 * local_38 >> 3;
  if (uVar6 <= p_Stack_78->MinPitch) {
    uVar6 = p_Stack_78->MinPitch;
  }
  CompressWidth = -p_Stack_78->PitchAlignment & (p_Stack_78->PitchAlignment - 1) + uVar6;
  uStack_54 = CompressHeight;
  if (local_70->TileInfo[pTexInfo->TileMode].LogicalSize != 0) {
    uVar1 = local_70->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
    uVar2 = local_70->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
    CompressWidth = CompressWidth + uVar1 + -1 & -uVar1;
    uStack_54 = CompressHeight + uVar2 + -1 & -uVar2;
  }
  uStack_50 = 0;
  uStack_4c = 0;
  (pTexInfo->Flags).Info =
       (anon_struct_8_44_94931171_for_Info)
       ((ulong)(pTexInfo->Flags).Info & 0xfffffffffffd7fff | 0x8000);
  uVar5 = GmmIsYUVPacked(pTexInfo->Format);
  WidthBytesPhysical = (ulong)CompressWidth;
  if (((uVar5 != '\0') || (pTexInfo->BitsPerPixel == 0x60)) ||
     (uVar6 = uStack_54, pTexInfo->BitsPerPixel == 0x30)) {
    if (CompressWidth == 0) {
      iVar10 = 0x11;
    }
    else {
      iVar10 = (CompressWidth + 0xf) / CompressWidth + 1;
    }
    uVar6 = uStack_54 + iVar10;
  }
  if ((((*(ulong *)&(((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext)->WaTable
                    ).field_0x4 & 0x100000000000) != 0) &&
      (bVar4 = GmmIsYUVFormatLCUAligned(pTexInfo->Format), bVar4)) &&
     (uVar5 = GmmIsPlanar(pTexInfo->Format), uVar5 == '\0')) {
    uVar6 = uVar6 + 0x3f & 0xffffffc0;
  }
  GVar11 = GmmTextureCalc::FillTexPitchAndSize
                     ((GmmTextureCalc *)this,pTexInfo,WidthBytesPhysical,uVar6 + 1 & 0xfffffffe,
                      p_Stack_78);
  if (GVar11 == GMM_SUCCESS) {
    (*(this->super_GmmGen9TextureCalc).super_GmmTextureCalc._vptr_GmmTextureCalc[7])(this,pTexInfo);
  }
  return GVar11;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen10TextureCalc::FillTex2D(GMM_TEXTURE_INFO * pTexInfo,
                                                              __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   Width, Height, BitsPerPixel;
    uint32_t   HAlign, VAlign, DAlign, CompressHeight, CompressWidth, CompressDepth;
    uint32_t   AlignedWidth, BlockHeight, ExpandedArraySize, Pitch;
    uint8_t    Compress = 0;
    GMM_STATUS Status;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    BitsPerPixel = pTexInfo->BitsPerPixel;
    if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        // Aux Surfaces are 8bpp.
        BitsPerPixel = 8;
    }

    Height = pTexInfo->BaseHeight;
    Width  = GFX_ULONG_CAST(pTexInfo->BaseWidth);

    pTexInfo->MSAA.NumSamples = GFX_MAX(pTexInfo->MSAA.NumSamples, 1);

    if(pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs)
    {
        FindMipTailStartLod(pTexInfo);
    }

    ExpandedArraySize =
    GFX_MAX(pTexInfo->ArraySize, 1) *
    ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1) *             // Cubemaps simply 6-element, 2D arrays.
    ((pTexInfo->Type == RESOURCE_3D) ? pTexInfo->Depth : 1) * // 3D's simply 2D arrays.
    ((pTexInfo->Flags.Gpu.Depth || pTexInfo->Flags.Gpu.SeparateStencil ||
      (pTexInfo->Flags.Info.TiledYs || pTexInfo->Flags.Info.TiledYf)) ? // MSAA Ys samples are NOT stored as array planes.
     1 :
     pTexInfo->MSAA.NumSamples); // MSAA (non-Depth/Stencil) RT samples stored as array planes.

    if(pTexInfo->Flags.Info.TiledYs || pTexInfo->Flags.Info.TiledYf)
    {
        ExpandedArraySize = GFX_CEIL_DIV(ExpandedArraySize, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileDepth);
    }

    //
    // Check for color separation
    //
    if(pTexInfo->Flags.Gpu.ColorSeparation || pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        bool csRestrictionsMet = (((ExpandedArraySize <= 2) &&
                                   (ExpandedArraySize == pTexInfo->ArraySize) &&
                                   ((pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM_SRGB)) &&
                                   ((pTexInfo->Flags.Gpu.ColorSeparation && (Width % 16) == 0) ||
                                    (pTexInfo->Flags.Gpu.ColorSeparationRGBX && (Width % 12) == 0))));

        if(csRestrictionsMet)
        {
            ExpandedArraySize = GMM_COLOR_SEPARATION_ARRAY_SIZE;
        }
        else
        {
            pTexInfo->Flags.Gpu.ColorSeparation     = false;
            pTexInfo->Flags.Gpu.ColorSeparationRGBX = false;
        }
    }

    HAlign = pTexInfo->Alignment.HAlign;
    VAlign = pTexInfo->Alignment.VAlign;
    DAlign = pTexInfo->Alignment.DAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    Compress = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    /////////////////////////////////
    // Calculate Block Surface Height
    /////////////////////////////////

    if(ExpandedArraySize > 1)
    {
        uint32_t Alignment = VAlign;
        if((pTexInfo->Type == RESOURCE_3D && !pTexInfo->Flags.Info.Linear) ||
           (pTexInfo->Flags.Gpu.S3dDx && pGmmLibContext->GetSkuTable().FtrDisplayEngineS3d) ||
	   (pTexInfo->Flags.Wa.MediaPipeUsage))
        {
            Alignment = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
	    //Gmm uses TileY for Stencil allocations, having half TileW height (TileY width compensates)
            if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
            {
                Alignment *= 2;
            }
        }

        // Calculate the overall Block height...Mip0Height + Max(Mip1Height, Sum of Mip2Height..MipnHeight)
        BlockHeight = Get2DMipMapTotalHeight(pTexInfo);
        BlockHeight = GFX_ALIGN_NP2(BlockHeight, Alignment);

        // GMM internally uses QPitch as the logical distance between slices, but translates
        // as appropriate to service client queries in GmmResGetQPitch.
        pTexInfo->Alignment.QPitch = BlockHeight;

        if(Compress)
        {
            BlockHeight = GFX_CEIL_DIV(BlockHeight, CompressHeight);

            BlockHeight = GetAligned3DBlockHeight(pTexInfo, BlockHeight, ExpandedArraySize);
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
        {
            BlockHeight /= 2;
        }
        else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            BlockHeight /= 16;
        }

        BlockHeight *= ExpandedArraySize;
    }
    else
    {
        pTexInfo->Alignment.QPitch = 0;

        BlockHeight = Get2DMipMapHeight(pTexInfo);
    }

    ///////////////////////////////////
    // Calculate Pitch
    ///////////////////////////////////

    AlignedWidth = __GMM_EXPAND_WIDTH(this, Width, HAlign, pTexInfo);

    // For Non - planar surfaces, the alignment is done on the entire height of the allocation
    if(pGmmLibContext->GetWaTable().WaAlignYUVResourceToLCU &&
       GmmIsYUVFormatLCUAligned(pTexInfo->Format))
    {
        AlignedWidth = GFX_ALIGN(AlignedWidth, GMM_SCANLINES(GMM_MAX_LCU_SIZE));
    }

    // Calculate special pitch case of small dimensions where LOD1 + LOD2 widths
    // are greater than LOD0. e.g. dimensions 4x4 and MinPitch == 1
    if((pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs) &&
       (pTexInfo->Alignment.MipTailStartLod < 2))
    {
        // Do nothing -- all mips are in LOD0/LOD1, which is already width aligned.
    }
    else if(pTexInfo->MaxLod >= 2)
    {
        uint32_t AlignedWidthLod1, AlignedWidthLod2;

        AlignedWidthLod1 = __GMM_EXPAND_WIDTH(this, Width >> 1, HAlign, pTexInfo);
        AlignedWidthLod2 = __GMM_EXPAND_WIDTH(this, Width >> 2, HAlign, pTexInfo);

        AlignedWidth = GFX_MAX(AlignedWidth, AlignedWidthLod1 + AlignedWidthLod2);
    }

    if(Compress)
    {
        AlignedWidth = GFX_CEIL_DIV(AlignedWidth, CompressWidth);
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
    {
        AlignedWidth *= 2;
    }
    else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        switch(pTexInfo->BitsPerPixel)
        {
            case 32:
                AlignedWidth /= 8;
                break;
            case 64:
                AlignedWidth /= 4;
                break;
            case 128:
                AlignedWidth /= 2;
                break;
            default:
                __GMM_ASSERT(0);
        }
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparation)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_WIDTH_DIVISION;
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION;
    }

    // Default pitch
    Pitch = AlignedWidth * BitsPerPixel >> 3;

    // Make sure the pitch satisfy linear min pitch requirment
    Pitch = GFX_MAX(Pitch, pRestrictions->MinPitch);

    // Make sure pitch satisfy alignment restriction
    Pitch = GFX_ALIGN(Pitch, pRestrictions->PitchAlignment);

    ////////////////////
    // Adjust for Tiling
    ////////////////////

    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        Pitch       = GFX_ALIGN(Pitch, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth);
        BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
    }

    GMM_ASSERTDPF(pTexInfo->Flags.Info.LayoutBelow || !pTexInfo->Flags.Info.LayoutRight, "MIPLAYOUT_RIGHT not supported after Gen6!");
    pTexInfo->Flags.Info.LayoutBelow = 1;
    pTexInfo->Flags.Info.LayoutRight = 0;

    // If a texture is YUV packed, 96, or 48 bpp then one row plus 16 bytes of
    // padding needs to be added. Since this will create a none pitch aligned
    // surface the padding is aligned to the next row
    if(GmmIsYUVPacked(pTexInfo->Format) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(96)) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(48)))
    {
        BlockHeight += GMM_SCANLINES(1) + GFX_CEIL_DIV(GMM_BYTES(16), Pitch);
    }

    // For Non-planar surfaces, the alignment is done on the entire height of the allocation
    if(pGmmLibContext->GetWaTable().WaAlignYUVResourceToLCU &&
        GmmIsYUVFormatLCUAligned(pTexInfo->Format) &&
       !GmmIsPlanar(pTexInfo->Format))
    {
        BlockHeight = GFX_ALIGN(BlockHeight, GMM_SCANLINES(GMM_MAX_LCU_SIZE));
    }

    // Align height to even row to cover for HW over-fetch
    BlockHeight = GFX_ALIGN(BlockHeight, __GMM_EVEN_ROW);

    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, Pitch, BlockHeight, pRestrictions)) == GMM_SUCCESS)
    {
        Fill2DTexOffsetAddress(pTexInfo);
    }

    GMM_DPF_EXIT;

    return (Status);
}